

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::UnmapBuffer
          (DeviceContextVkImpl *this,IBuffer *pBuffer,MAP_TYPE MapType)

{
  MEMORY_PROPERTIES MVar1;
  BufferVkImpl *pBuffVk;
  BufferDesc *Args;
  VkBuffer_T *pVVar2;
  Char *pCVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  char (*in_R8) [34];
  undefined1 local_98 [8];
  string msg_1;
  VkBuffer vkSrcBuff;
  VulkanDynamicAllocation *DynAlloc;
  undefined1 local_58 [8];
  string msg;
  Uint32 DynamicBufferId;
  BufferDesc *BuffDesc;
  BufferVkImpl *pBufferVk;
  MAP_TYPE MapType_local;
  IBuffer *pBuffer_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::UnmapBuffer
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pBuffer,MapType);
  pBuffVk = ClassPtrCast<Diligent::BufferVkImpl,Diligent::IBuffer>(pBuffer);
  Args = DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>::
         GetDesc((DeviceObjectBase<Diligent::IBufferVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferDesc>
                  *)pBuffVk);
  if (MapType == MAP_READ) {
    if ((Args->Usage == USAGE_STAGING) || (Args->Usage == USAGE_UNIFIED)) {
      MVar1 = BufferBase<Diligent::EngineVkImplTraits>::GetMemoryProperties
                        (&pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>);
      MVar1 = Diligent::operator&(MVar1,MEMORY_PROPERTY_HOST_COHERENT);
      if (MVar1 == MEMORY_PROPERTY_UNKNOWN) {
        BufferVkImpl::InvalidateMappedRange(pBuffVk,0,Args->Size);
      }
    }
  }
  else if (MapType == MAP_WRITE) {
    if ((Args->Usage == USAGE_STAGING) || (Args->Usage == USAGE_UNIFIED)) {
      MVar1 = BufferBase<Diligent::EngineVkImplTraits>::GetMemoryProperties
                        (&pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>);
      MVar1 = Diligent::operator&(MVar1,MEMORY_PROPERTY_HOST_COHERENT);
      if (MVar1 == MEMORY_PROPERTY_UNKNOWN) {
        BufferVkImpl::FlushMappedRange(pBuffVk,0,Args->Size);
      }
    }
    else if ((Args->Usage == USAGE_DYNAMIC) &&
            (pVVar2 = VulkanUtilities::VulkanObjectWrapper::operator_cast_to_VkBuffer_T_
                                ((VulkanObjectWrapper *)&pBuffVk->m_VulkanBuffer),
            pVVar2 != (VkBuffer_T *)0x0)) {
      msg.field_2._12_4_ =
           BufferBase<Diligent::EngineVkImplTraits>::GetDynamicBufferId
                     (&pBuffVk->super_BufferBase<Diligent::EngineVkImplTraits>);
      if (msg.field_2._12_4_ == 0xffffffff) {
        FormatString<char[17],char_const*,char[34]>
                  ((string *)local_58,(Diligent *)"Dynamic buffer \'",(char (*) [17])Args,
                   (char **)"\' does not have dynamic buffer ID",in_R8);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"UnmapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x8de);
        std::__cxx11::string::~string((string *)local_58);
      }
      uVar4 = (ulong)(uint)msg.field_2._12_4_;
      sVar5 = std::
              vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
              ::size(&this->m_MappedBuffers);
      if (uVar4 < sVar5) {
        pvVar6 = std::
                 vector<Diligent::DeviceContextVkImpl::MappedBuffer,_std::allocator<Diligent::DeviceContextVkImpl::MappedBuffer>_>
                 ::operator[](&this->m_MappedBuffers,(ulong)(uint)msg.field_2._12_4_);
        msg_1.field_2._8_8_ =
             VulkanDynamicMemoryManager::GetVkBuffer((pvVar6->Allocation).pDynamicMemMgr);
        UpdateBufferRegion(this,pBuffVk,0,Args->Size,(VkBuffer)msg_1.field_2._8_8_,
                           (pvVar6->Allocation).AlignedOffset,
                           RESOURCE_STATE_TRANSITION_MODE_TRANSITION);
      }
      else {
        FormatString<char[19],char_const*,char[34]>
                  ((string *)local_98,(Diligent *)"Unmapping buffer \'",(char (*) [19])Args,
                   (char **)"\' that was not previously mapped.",in_R8);
        pCVar3 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar3,"UnmapBuffer",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x8e7);
        std::__cxx11::string::~string((string *)local_98);
      }
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::UnmapBuffer(IBuffer* pBuffer, MAP_TYPE MapType)
{
    TDeviceContextBase::UnmapBuffer(pBuffer, MapType);
    BufferVkImpl* const pBufferVk = ClassPtrCast<BufferVkImpl>(pBuffer);
    const BufferDesc&   BuffDesc  = pBufferVk->GetDesc();

    if (MapType == MAP_READ)
    {
        if (BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED)
        {
            if ((pBufferVk->GetMemoryProperties() & MEMORY_PROPERTY_HOST_COHERENT) == 0)
            {
                pBufferVk->InvalidateMappedRange(0, BuffDesc.Size);
            }
        }
    }
    else if (MapType == MAP_WRITE)
    {
        if (BuffDesc.Usage == USAGE_STAGING || BuffDesc.Usage == USAGE_UNIFIED)
        {
            if ((pBufferVk->GetMemoryProperties() & MEMORY_PROPERTY_HOST_COHERENT) == 0)
            {
                pBufferVk->FlushMappedRange(0, BuffDesc.Size);
            }
        }
        else if (BuffDesc.Usage == USAGE_DYNAMIC)
        {
            if (pBufferVk->m_VulkanBuffer != VK_NULL_HANDLE)
            {
                const Uint32 DynamicBufferId = pBufferVk->GetDynamicBufferId();
                VERIFY(DynamicBufferId != ~0u, "Dynamic buffer '", BuffDesc.Name, "' does not have dynamic buffer ID");
                if (DynamicBufferId < m_MappedBuffers.size())
                {
                    VulkanDynamicAllocation& DynAlloc  = m_MappedBuffers[DynamicBufferId].Allocation;
                    VkBuffer                 vkSrcBuff = DynAlloc.pDynamicMemMgr->GetVkBuffer();
                    UpdateBufferRegion(pBufferVk, 0, BuffDesc.Size, vkSrcBuff, DynAlloc.AlignedOffset, RESOURCE_STATE_TRANSITION_MODE_TRANSITION);
                }
                else
                {
                    DEV_ERROR("Unmapping buffer '", BuffDesc.Name, "' that was not previously mapped.");
                }
            }
        }
    }
}